

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall Generator::registerPropertyStrings(Generator *this)

{
  bool bVar1;
  long lVar2;
  PropertyDef *p;
  PropertyDef *s;
  
  lVar2 = (this->cdef->propertyList).d.size;
  if (lVar2 != 0) {
    s = (this->cdef->propertyList).d.ptr;
    lVar2 = lVar2 * 0x158;
    do {
      strreg(this,&s->name);
      bVar1 = isBuiltinType(&s->type);
      if (!bVar1) {
        strreg(this,&s->type);
      }
      s = s + 1;
      lVar2 = lVar2 + -0x158;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void Generator::registerPropertyStrings()
{
    for (const PropertyDef &p : std::as_const(cdef->propertyList)) {
        strreg(p.name);
        if (!isBuiltinType(p.type))
            strreg(p.type);
    }
}